

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O3

void __thiscall helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_add_order *m)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  order order;
  undefined1 auVar4 [24];
  side_type sVar5;
  iterator iVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  order_book *this_00;
  undefined7 uStack_7f;
  event local_70;
  
  local_70._0_8_ = ZEXT28(m->StockLocate);
  iVar6 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->order_book_id_map)._M_h,(key_type *)&local_70);
  if (iVar6.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>.
      _M_cur != (__node_type *)0x0) {
    this_00 = (order_book *)
              ((long)iVar6.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>
                     ._M_cur + 0x10);
    uVar3 = m->OrderReferenceNumber;
    uVar1 = m->Price;
    uVar2 = m->Shares;
    sVar5 = itch50_side(m->BuySellIndicator);
    uVar8 = (ulong)*(ushort *)&m->field_0x9 << 0x20;
    uVar9 = (ulong)*(uint6 *)&m->field_0x5;
    uVar8 = ((uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
             (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 |
            uVar9 << 0x38) >> 0x10;
    order._33_7_ = uStack_7f;
    order.side = sVar5;
    auVar4 = ZEXT1224(CONCAT48(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                               uVar1 << 0x18,uVar3)) << 0x40;
    order.quantity._0_4_ =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    order.level = (price_level *)auVar4._0_8_;
    order.id = auVar4._8_8_;
    order.price = auVar4._16_8_;
    order.quantity._4_4_ = 0;
    order.timestamp = uVar8;
    order_book::add(this_00,order);
    *(ulong *)((long)iVar6.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>
                     ._M_cur + 0x30) = uVar8;
    make_ob_event(&local_70,(string *)this_00,uVar8,this_00,0);
    if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar7 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._symbol._M_dataplus._M_p != &local_70._symbol.field_2) {
        operator_delete(local_70._symbol._M_dataplus._M_p,
                        local_70._symbol.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar7);
    }
    (*(this->_process_event)._M_invoker)((_Any_data *)this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._symbol._M_dataplus._M_p != &local_70._symbol.field_2) {
      operator_delete(local_70._symbol._M_dataplus._M_p,
                      local_70._symbol.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_add_order* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;

        uint64_t order_id = m->OrderReferenceNumber;
        uint64_t price    = be32toh(m->Price);
        uint32_t quantity = be32toh(m->Shares);
        auto     side     = itch50_side(m->BuySellIndicator);
        uint64_t timestamp = itch50_timestamp(m->Timestamp);
        order o{order_id, price, quantity, side, timestamp};
        ob.add(std::move(o));
        ob.set_timestamp(timestamp);
        _process_event(make_ob_event(ob.symbol(), timestamp, &ob));
    }
}